

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posix_file.c
# Opt level: O2

int nni_plat_file_put(char *name,void *data,size_t len)

{
  char *pcVar1;
  int iVar2;
  char *pcVar3;
  char *__path;
  int *piVar4;
  FILE *__s;
  size_t sVar5;
  char *pcVar6;
  
  pcVar3 = strchr(name,0x2f);
  if (pcVar3 != (char *)0x0) {
    __path = nni_strdup(name);
    pcVar3 = __path;
    if (__path == (char *)0x0) {
      return 2;
    }
    while (pcVar3 = strchr(pcVar3,0x2f), pcVar3 != (char *)0x0) {
      if (pcVar3 != __path) {
        *pcVar3 = '\0';
        iVar2 = mkdir(__path,0x1c0);
        *pcVar3 = '/';
        if (iVar2 != 0) {
          piVar4 = __errno_location();
          if (*piVar4 != 0x11) {
            iVar2 = nni_plat_errno(*piVar4);
            goto LAB_00137773;
          }
        }
      }
      pcVar6 = pcVar3 + -1;
      do {
        pcVar3 = pcVar6 + 1;
        pcVar1 = pcVar6 + 1;
        pcVar6 = pcVar3;
      } while (*pcVar1 == '/');
    }
    iVar2 = 0;
LAB_00137773:
    nni_strfree(__path);
    if (iVar2 != 0) {
      return iVar2;
    }
  }
  __s = fopen(name,"wb");
  if (__s != (FILE *)0x0) {
    sVar5 = fwrite(data,1,len,__s);
    iVar2 = 0;
    if (sVar5 != len) {
      piVar4 = __errno_location();
      iVar2 = nni_plat_errno(*piVar4);
      unlink(name);
    }
    fclose(__s);
    return iVar2;
  }
  piVar4 = __errno_location();
  iVar2 = nni_plat_errno(*piVar4);
  return iVar2;
}

Assistant:

int
nni_plat_file_put(const char *name, const void *data, size_t len)
{
	FILE *f;
	int   rv = 0;

	// It is possible that the name contains a directory path
	// that does not exist.  In this case we try to create the
	// entire tree.
	if (strchr(name, '/') != NULL) {
		if ((rv = nni_plat_make_parent_dirs(name)) != 0) {
			return (rv);
		}
	}

	if ((f = fopen(name, "wb")) == NULL) {
		return (nni_plat_errno(errno));
	}
	if (fwrite(data, 1, len, f) != len) {
		rv = nni_plat_errno(errno);
		(void) unlink(name);
	}
	(void) fclose(f);
	return (rv);
}